

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_write_log(http_s *h)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  fio_lock_i fVar4;
  char cVar5;
  FIOBJ dest;
  FIOBJ key_hash;
  FIOBJ FVar6;
  ulong num;
  uint uVar7;
  fiobj_object_vtable_s *pfVar8;
  size_t len;
  char cVar9;
  char *data;
  uint uVar10;
  fio_str_info_s buff;
  fio_lock_i ret_2;
  timespec end;
  fio_str_info_s local_78;
  fio_str_info_s local_58;
  timespec local_40;
  
  dest = fiobj_str_buf(0x80);
  FVar6 = (h->private_data).out_headers;
  if (((uint)HTTP_HEADER_CONTENT_LENGTH & 7) == 2) {
    key_hash = fiobj_str_hash(HTTP_HEADER_CONTENT_LENGTH);
  }
  else {
    uVar7 = (uint)HTTP_HEADER_CONTENT_LENGTH & 6;
    key_hash = HTTP_HEADER_CONTENT_LENGTH;
    if (((uVar7 != 6) && (HTTP_HEADER_CONTENT_LENGTH != 0)) &&
       ((HTTP_HEADER_CONTENT_LENGTH & 1) == 0)) {
      if ((HTTP_HEADER_CONTENT_LENGTH & 6) == 0) {
        switch(*(undefined1 *)(HTTP_HEADER_CONTENT_LENGTH & 0xfffffffffffffff8)) {
        case 0x27:
          pfVar8 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          goto switchD_0014db34_caseD_28;
        case 0x29:
          pfVar8 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          goto switchD_0014db34_caseD_2a;
        case 0x2b:
          pfVar8 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar8 = &FIOBJECT_VTABLE_NUMBER;
        }
      }
      else if (uVar7 == 2) {
switchD_0014db34_caseD_28:
        pfVar8 = &FIOBJECT_VTABLE_STRING;
      }
      else {
switchD_0014db34_caseD_2a:
        pfVar8 = &FIOBJECT_VTABLE_HASH;
      }
      (*pfVar8->to_str)(&local_78,HTTP_HEADER_CONTENT_LENGTH);
      key_hash = fio_siphash13(local_78.data,local_78.len,0x1456f2,0x145bc9);
    }
  }
  FVar6 = fiobj_hash_get2(FVar6,key_hash);
  if ((FVar6 & 1) == 0) {
    uVar7 = (uint)FVar6 & 6;
    if (FVar6 == 0 || uVar7 == 6) {
      num = (ulong)(FVar6 == 0x16);
    }
    else {
      if ((FVar6 & 6) == 0) {
        switch(*(undefined1 *)(FVar6 & 0xfffffffffffffff8)) {
        case 0x27:
          pfVar8 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          goto switchD_0014dc00_caseD_28;
        case 0x29:
          pfVar8 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          goto switchD_0014dc00_caseD_2a;
        case 0x2b:
          pfVar8 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar8 = &FIOBJECT_VTABLE_NUMBER;
        }
      }
      else if (uVar7 == 2) {
switchD_0014dc00_caseD_28:
        pfVar8 = &FIOBJECT_VTABLE_STRING;
      }
      else {
switchD_0014dc00_caseD_2a:
        pfVar8 = &FIOBJECT_VTABLE_HASH;
      }
      num = (*pfVar8->to_i)(FVar6);
    }
  }
  else {
    num = FVar6 >> 1 & 0x3fffffffffffffff | (long)FVar6 >> 0x3f & 0xc000000000000000U;
  }
  clock_gettime(0,&local_40);
  lVar2 = (h->received_at).tv_sec;
  lVar3 = (h->received_at).tv_nsec;
  fio_peer_addr(&local_78,*(intptr_t *)((h->private_data).flag + 0x30));
  fiobj_str_write(dest,local_78.data,local_78.len);
  cVar9 = (char)dest;
  uVar7 = (uint)dest;
  if (dest == 0) {
LAB_0014dc59:
    local_78.data = anon_var_dwarf_20c;
    uVar10 = 4;
    goto LAB_0014dc6c;
  }
  if ((dest & 1) == 0) {
    switch(uVar7 & 6) {
    case 0:
      cVar5 = *(char *)(dest & 0xfffffffffffffff8);
LAB_0014dc95:
      switch(cVar5) {
      case '\'':
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_0014dc8a_caseD_2;
      case ')':
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_0014dc8a_caseD_4;
      case '+':
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_0014dc8a_caseD_2:
      pfVar8 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_0014dc8a_caseD_4:
      pfVar8 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar9 == '&') {
        local_78.data = anon_var_dwarf_217;
        uVar10 = 5;
      }
      else {
        if ((uVar7 & 0xff) != 0x16) {
          cVar5 = cVar9;
          if ((uVar7 & 0xff) == 6) goto LAB_0014dc59;
          goto LAB_0014dc95;
        }
        local_78.data = anon_var_dwarf_222;
        uVar10 = 4;
      }
LAB_0014dc6c:
      local_78.capa = 0;
      local_78.len = (size_t)uVar10;
      goto LAB_0014dce6;
    }
    (*pfVar8->to_str)(&local_78,dest);
  }
  else {
    fio_ltocstr(&local_78,(long)dest >> 1);
  }
LAB_0014dce6:
  if (local_78.len == 0) {
    builtin_strncpy(local_78.data,"[unknown]",9);
    local_78.len = 9;
  }
  builtin_strncpy(local_78.data + local_78.len," - - [",6);
  local_78.len = local_78.len + 6;
  fiobj_str_resize(dest,local_78.len);
  LOCK();
  UNLOCK();
  if (date_lock != '\0') {
    do {
      date_lock = '\x01';
      local_58.capa = 0;
      local_58.len = 1;
      nanosleep((timespec *)&local_58,(timespec *)0x0);
      LOCK();
      UNLOCK();
    } while (date_lock != '\0');
  }
  FVar6 = current_date;
  date_lock = '\x01';
  if ((((~(uint)current_date & 6) != 0) && (current_date != 0)) && ((current_date & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((current_date & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  fVar4 = date_lock;
  LOCK();
  date_lock = '\0';
  UNLOCK();
  local_58.capa = CONCAT71(local_58.capa._1_7_,fVar4);
  fiobj_str_concat(dest,current_date);
  fiobj_free(FVar6);
  fiobj_str_write(dest,"] \"",3);
  fiobj_str_concat(dest,h->method);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->path);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->version);
  fiobj_str_write(dest,"\" ",2);
  if ((long)num < 1) {
    FVar6 = fiobj_num_tmp(h->status);
    fiobj_str_concat(dest,FVar6);
    data = " -- ";
    len = 4;
  }
  else {
    fiobj_str_write_i(dest,h->status);
    fiobj_str_write(dest," ",1);
    fiobj_str_write_i(dest,num);
    data = "b ";
    len = 2;
  }
  fiobj_str_write(dest,data,len);
  fiobj_str_write_i(dest,(local_40.tv_nsec - lVar3) / 1000000 + (local_40.tv_sec - lVar2) * 1000);
  fiobj_str_write(dest,"ms\r\n",4);
  if (dest == 0) {
LAB_0014defb:
    local_58.data = anon_var_dwarf_20c;
    uVar7 = 4;
    goto LAB_0014df0e;
  }
  if ((dest & 1) != 0) {
    fio_ltocstr(&local_58,(long)dest >> 1);
    goto LAB_0014df8d;
  }
  switch(uVar7 & 6) {
  case 0:
    cVar9 = *(char *)(dest & 0xfffffffffffffff8);
LAB_0014df38:
    switch(cVar9) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0014df2d_caseD_2;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0014df2d_caseD_4;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_0014df2d_caseD_2:
    pfVar8 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0014df2d_caseD_4:
    pfVar8 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar9 == '&') {
      local_58.data = anon_var_dwarf_217;
      uVar7 = 5;
    }
    else {
      if ((uVar7 & 0xff) != 0x16) {
        if ((uVar7 & 0xff) == 6) goto LAB_0014defb;
        goto LAB_0014df38;
      }
      local_58.data = anon_var_dwarf_222;
      uVar7 = 4;
    }
LAB_0014df0e:
    local_58.capa = 0;
    local_58.len = (size_t)uVar7;
    goto LAB_0014df8d;
  }
  (*pfVar8->to_str)(&local_58,dest);
LAB_0014df8d:
  local_78.data = local_58.data;
  local_78.capa = local_58.capa;
  local_78.len = local_58.len;
  fwrite(local_58.data,1,local_58.len,_stderr);
  fiobj_free(dest);
  return;
}

Assistant:

void http_write_log(http_s *h) {
  FIOBJ l = fiobj_str_buf(128);

  intptr_t bytes_sent = fiobj_obj2num(fiobj_hash_get2(
      h->private_data.out_headers, fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH)));

  struct timespec start, end;
  clock_gettime(CLOCK_REALTIME, &end);
  start = h->received_at;

  {
    // TODO Guess IP address from headers (forwarded) where possible
    fio_str_info_s peer = fio_peer_addr(http2protocol(h)->uuid);
    fiobj_str_write(l, peer.data, peer.len);
  }
  fio_str_info_s buff = fiobj_obj2cstr(l);

  if (buff.len == 0) {
    memcpy(buff.data, "[unknown]", 9);
    buff.len = 9;
  }
  memcpy(buff.data + buff.len, " - - [", 6);
  buff.len += 6;
  fiobj_str_resize(l, buff.len);
  {
    FIOBJ date;
    fio_lock(&date_lock);
    date = fiobj_dup(current_date);
    fio_unlock(&date_lock);
    fiobj_str_join(l, current_date);
    fiobj_free(date);
  }
  fiobj_str_write(l, "] \"", 3);
  fiobj_str_join(l, h->method);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->path);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->version);
  fiobj_str_write(l, "\" ", 2);
  if (bytes_sent > 0) {
    fiobj_str_write_i(l, h->status);
    fiobj_str_write(l, " ", 1);
    fiobj_str_write_i(l, bytes_sent);
    fiobj_str_write(l, "b ", 2);
  } else {
    fiobj_str_join(l, fiobj_num_tmp(h->status));
    fiobj_str_write(l, " -- ", 4);
  }

  bytes_sent = ((end.tv_sec - start.tv_sec) * 1000) +
               ((end.tv_nsec - start.tv_nsec) / 1000000);
  fiobj_str_write_i(l, bytes_sent);
  fiobj_str_write(l, "ms\r\n", 4);

  buff = fiobj_obj2cstr(l);
  fwrite(buff.data, 1, buff.len, stderr);
  fiobj_free(l);
}